

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<float,float,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,float *v,float v_min,float v_max,
               char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  uint uVar3;
  float *in_RCX;
  int in_EDX;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  uint in_R9D;
  float in_XMM0_Da;
  float linear_zero_pos_00;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImVec2 IVar9;
  float in_XMM1_Da;
  float in_XMM2_Da;
  undefined8 *in_stack_00000008;
  float grab_pos;
  float grab_t;
  float v_new_off_round;
  float v_new_off_floor;
  float v_new_off_f;
  float a_1;
  float a;
  float v_new;
  int decimal_precision;
  float delta;
  ImVec2 delta2;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  float linear_dist_max_to_0;
  float linear_dist_min_to_0;
  float linear_zero_pos;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  float v_range;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  bool is_power;
  bool is_decimal;
  ImGuiAxis axis;
  ImGuiStyle *style;
  ImGuiContext *g;
  float in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  float in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  float in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  float local_d8;
  undefined3 in_stack_ffffffffffffff30;
  uint3 uVar10;
  uint uVar11;
  undefined1 uVar12;
  float in_stack_ffffffffffffff34;
  float in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff3c;
  float in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  ImGuiInputReadMode in_stack_ffffffffffffff48;
  ImGuiNavDirSourceFlags in_stack_ffffffffffffff4c;
  undefined4 uStack_b0;
  float local_a8;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  float local_88;
  float local_84;
  float fStack_80;
  float local_78;
  bool local_71;
  float local_68;
  float local_54;
  float power_00;
  
  pIVar1 = GImGui;
  uVar3 = (uint)((in_R9D & 1) != 0);
  uVar11 = CONCAT13(1,in_stack_ffffffffffffff30);
  if (in_EDX != 4) {
    uVar11 = CONCAT13(in_EDX == 5,in_stack_ffffffffffffff30);
  }
  uVar12 = (undefined1)(uVar11 >> 0x18);
  uVar10 = (uint3)(ushort)uVar11;
  if ((in_XMM2_Da != 1.0) || (NAN(in_XMM2_Da))) {
    uVar10 = CONCAT12(uVar12,(ushort)uVar11);
  }
  power_00 = (float)CONCAT13(uVar12,uVar10);
  linear_zero_pos_00 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar3);
  fVar4 = ImVec2::operator[](in_RDI,(long)(int)uVar3);
  fVar4 = (linear_zero_pos_00 - fVar4) - 4.0;
  local_54 = (pIVar1->Style).GrabMinSize;
  if (in_XMM1_Da <= in_XMM0_Da) {
    local_d8 = in_XMM0_Da - in_XMM1_Da;
  }
  else {
    local_d8 = in_XMM1_Da - in_XMM0_Da;
  }
  local_84 = in_stack_ffffffffffffff18;
  if (((uVar11 & 0x1000000) == 0) && (0.0 <= local_d8)) {
    local_54 = ImMax<float>(fVar4 / (local_d8 + 1.0),(pIVar1->Style).GrabMinSize);
    local_84 = in_stack_ffffffffffffff18;
  }
  fVar5 = ImMin<float>(local_54,fVar4);
  fVar6 = ImVec2::operator[](in_RDI,(long)(int)uVar3);
  fVar6 = fVar5 * 0.5 + fVar6 + 2.0;
  fVar7 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar3);
  if (((uVar10 & 0x10000) == 0) || (0.0 <= in_XMM0_Da * in_XMM1_Da)) {
    local_68 = (float)(-(uint)(in_XMM0_Da < 0.0) & 0x3f800000);
  }
  else {
    in_stack_ffffffffffffff24 = in_XMM0_Da;
    if (in_XMM0_Da < 0.0) {
      in_stack_ffffffffffffff24 = -in_XMM0_Da;
    }
    local_68 = ImPow(0.0,2.233301e-39);
    in_stack_ffffffffffffff20 = in_XMM1_Da;
    if (in_XMM1_Da < 0.0) {
      in_stack_ffffffffffffff20 = -in_XMM1_Da;
    }
    fVar8 = ImPow(0.0,2.23344e-39);
    local_68 = local_68 / (local_68 + fVar8);
  }
  local_71 = false;
  if (pIVar1->ActiveId == in_ESI) {
    bVar2 = false;
    local_78 = 0.0;
    if (pIVar1->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar1->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
      }
      else {
        fVar8 = ImVec2::operator[](&(pIVar1->IO).MousePos,(long)(int)uVar3);
        if (fVar4 - fVar5 <= 0.0) {
          in_stack_ffffffffffffff1c = 0.0;
        }
        else {
          in_stack_ffffffffffffff1c = ImClamp<float>((fVar8 - fVar6) / (fVar4 - fVar5),0.0,1.0);
        }
        local_78 = in_stack_ffffffffffffff1c;
        if (uVar3 == 1) {
          local_78 = 1.0 - in_stack_ffffffffffffff1c;
        }
        bVar2 = true;
      }
    }
    else if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
      IVar9 = GetNavInputAmount2d(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,
                                  in_stack_ffffffffffffff44,in_stack_ffffffffffffff40);
      if (uVar3 == 0) {
        local_84 = IVar9.x;
      }
      else {
        fStack_80 = IVar9.y;
        local_84 = -fStack_80;
      }
      if ((pIVar1->NavActivatePressedId == in_ESI) && ((pIVar1->ActiveIdIsJustActivated & 1U) == 0))
      {
        ClearActiveID();
      }
      else if ((local_84 != 0.0) || (NAN(local_84))) {
        fVar4 = local_84;
        local_78 = SliderCalcRatioFromValueT<float,float>
                             ((ImGuiDataType)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                              in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,power_00,
                              linear_zero_pos_00);
        if ((uVar11 & 0x1000000) == 0) {
          in_stack_ffffffffffffff14 = 0.0;
        }
        else {
          in_stack_ffffffffffffff14 =
               (float)ImParseFormatPrecision
                                ((char *)CONCAT44(in_stack_ffffffffffffff1c,fVar4),
                                 (int)in_stack_ffffffffffffff14);
        }
        if (((int)in_stack_ffffffffffffff14 < 1) && ((uVar10 & 0x10000) == 0)) {
          if (((-100.0 <= local_d8) && (local_d8 <= 100.0)) || (bVar2 = IsNavInputDown(0xe), bVar2))
          {
            local_88 = (float)(~-(uint)(local_84 < 0.0) & 0x3f800000 |
                              -(uint)(local_84 < 0.0) & 0xbf800000) / local_d8;
          }
          else {
            local_88 = local_84 / 100.0;
          }
        }
        else {
          local_88 = local_84 / 100.0;
          bVar2 = IsNavInputDown(0xe);
          if (bVar2) {
            local_88 = local_88 / 10.0;
          }
        }
        bVar2 = IsNavInputDown(0xf);
        if (bVar2) {
          local_88 = local_88 * 10.0;
        }
        bVar2 = true;
        if (((1.0 <= local_78) && (0.0 < local_88)) || ((local_78 <= 0.0 && (local_88 < 0.0)))) {
          bVar2 = false;
          local_84 = fVar4;
        }
        else {
          local_78 = ImSaturate(local_78 + local_88);
          local_84 = fVar4;
        }
      }
    }
    if (bVar2) {
      if ((uVar10 & 0x10000) == 0) {
        if ((uVar11 & 0x1000000) == 0) {
          in_stack_ffffffffffffff60 = (in_XMM1_Da - in_XMM0_Da) * local_78;
          in_stack_ffffffffffffff64 = in_stack_ffffffffffffff60;
        }
        else {
          ImLerp<float>(in_XMM0_Da,in_XMM1_Da,local_78);
        }
      }
      else if (local_68 <= local_78) {
        ImFabs(local_68 - 1.0);
        in_stack_ffffffffffffff68 = ImPow(0.0,2.235312e-39);
        fVar4 = ImMax<float>(in_XMM0_Da,0.0);
        ImLerp<float>(fVar4,in_XMM1_Da,in_stack_ffffffffffffff68);
      }
      else {
        in_stack_ffffffffffffff6c = ImPow(0.0,2.235067e-39);
        fVar4 = ImMin<float>(in_XMM1_Da,0.0);
        ImLerp<float>(fVar4,in_XMM0_Da,in_stack_ffffffffffffff6c);
      }
      fVar4 = RoundScalarWithFormatT<float,float>
                        ((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                         (ImGuiDataType)in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
      if ((*in_RCX != fVar4) || (NAN(*in_RCX) || NAN(fVar4))) {
        *in_RCX = fVar4;
        local_71 = true;
      }
    }
  }
  local_a8 = SliderCalcRatioFromValueT<float,float>
                       ((ImGuiDataType)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                        in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,power_00,
                        linear_zero_pos_00);
  if (uVar3 == 1) {
    local_a8 = 1.0 - local_a8;
  }
  ImLerp<float>(fVar6,-fVar5 * 0.5 + (fVar7 - 2.0),local_a8);
  if (uVar3 == 0) {
    ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff1c,local_84,in_stack_ffffffffffffff14,
                   in_stack_ffffffffffffff10);
    *in_stack_00000008 = CONCAT44(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
    in_stack_00000008[1] = CONCAT44(uStack_b0,in_stack_ffffffffffffff4c);
  }
  else {
    ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff1c,local_84,in_stack_ffffffffffffff14,
                   in_stack_ffffffffffffff10);
    *in_stack_00000008 = CONCAT44(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
    in_stack_00000008[1] = CONCAT44(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  }
  return local_71;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz*0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz*0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f/power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f/power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (!is_decimal && v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    // Output grab position so it can be displayed by the caller
    float grab_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
    if (axis == ImGuiAxis_Y)
        grab_t = 1.0f - grab_t;
    const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
    if (axis == ImGuiAxis_X)
        *out_grab_bb = ImRect(grab_pos - grab_sz*0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz*0.5f, bb.Max.y - grab_padding);
    else
        *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz*0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz*0.5f);

    return value_changed;
}